

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_nlzc_h_mips64el(CPUMIPSState_conflict10 *env,uint32_t wd,uint32_t ws)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  
  uVar2 = (ulong)*(ushort *)((env->active_fpu).fpr + ws);
  iVar5 = 0x10;
  uVar6 = 8;
  do {
    uVar4 = uVar2 >> (sbyte)uVar6;
    uVar7 = uVar6;
    if (uVar4 == 0) {
      uVar7 = 0;
      uVar4 = uVar2;
    }
    uVar2 = uVar4;
    iVar5 = iVar5 - uVar7;
    bVar1 = 1 < uVar6;
    uVar6 = uVar6 >> 1;
  } while (bVar1);
  lVar3 = (ulong)wd * 0x10;
  *(short *)((env->active_fpu).fpr + wd) = (short)iVar5 - (short)uVar2;
  uVar2 = (ulong)*(ushort *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 2);
  iVar5 = 0x10;
  uVar6 = 8;
  do {
    uVar4 = uVar2 >> (sbyte)uVar6;
    uVar7 = uVar6;
    if (uVar4 == 0) {
      uVar7 = 0;
      uVar4 = uVar2;
    }
    uVar2 = uVar4;
    iVar5 = iVar5 - uVar7;
    bVar1 = 1 < uVar6;
    uVar6 = uVar6 >> 1;
  } while (bVar1);
  *(short *)((long)(env->active_fpu).fpr + lVar3 + 2) = (short)iVar5 - (short)uVar2;
  uVar2 = (ulong)*(ushort *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4);
  iVar5 = 0x10;
  uVar6 = 8;
  do {
    uVar4 = uVar2 >> (sbyte)uVar6;
    uVar7 = uVar6;
    if (uVar4 == 0) {
      uVar7 = 0;
      uVar4 = uVar2;
    }
    uVar2 = uVar4;
    iVar5 = iVar5 - uVar7;
    bVar1 = 1 < uVar6;
    uVar6 = uVar6 >> 1;
  } while (bVar1);
  *(short *)((long)(env->active_fpu).fpr + lVar3 + 4) = (short)iVar5 - (short)uVar2;
  uVar2 = (ulong)*(ushort *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 6);
  iVar5 = 0x10;
  uVar6 = 8;
  do {
    uVar4 = uVar2 >> (sbyte)uVar6;
    uVar7 = uVar6;
    if (uVar4 == 0) {
      uVar7 = 0;
      uVar4 = uVar2;
    }
    uVar2 = uVar4;
    iVar5 = iVar5 - uVar7;
    bVar1 = 1 < uVar6;
    uVar6 = uVar6 >> 1;
  } while (bVar1);
  *(short *)((long)(env->active_fpu).fpr + lVar3 + 6) = (short)iVar5 - (short)uVar2;
  uVar2 = (ulong)*(ushort *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
  iVar5 = 0x10;
  uVar6 = 8;
  do {
    uVar4 = uVar2 >> (sbyte)uVar6;
    uVar7 = uVar6;
    if (uVar4 == 0) {
      uVar7 = 0;
      uVar4 = uVar2;
    }
    uVar2 = uVar4;
    iVar5 = iVar5 - uVar7;
    bVar1 = 1 < uVar6;
    uVar6 = uVar6 >> 1;
  } while (bVar1);
  *(short *)((long)(env->active_fpu).fpr + lVar3 + 8) = (short)iVar5 - (short)uVar2;
  uVar2 = (ulong)*(ushort *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 10);
  iVar5 = 0x10;
  uVar6 = 8;
  do {
    uVar4 = uVar2 >> (sbyte)uVar6;
    uVar7 = uVar6;
    if (uVar4 == 0) {
      uVar7 = 0;
      uVar4 = uVar2;
    }
    uVar2 = uVar4;
    iVar5 = iVar5 - uVar7;
    bVar1 = 1 < uVar6;
    uVar6 = uVar6 >> 1;
  } while (bVar1);
  *(short *)((long)(env->active_fpu).fpr + lVar3 + 10) = (short)iVar5 - (short)uVar2;
  uVar2 = (ulong)*(ushort *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc);
  iVar5 = 0x10;
  uVar6 = 8;
  do {
    uVar4 = uVar2 >> (sbyte)uVar6;
    uVar7 = uVar6;
    if (uVar4 == 0) {
      uVar7 = 0;
      uVar4 = uVar2;
    }
    uVar2 = uVar4;
    iVar5 = iVar5 - uVar7;
    bVar1 = 1 < uVar6;
    uVar6 = uVar6 >> 1;
  } while (bVar1);
  *(short *)((long)(env->active_fpu).fpr + lVar3 + 0xc) = (short)iVar5 - (short)uVar2;
  uVar2 = (ulong)*(ushort *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xe);
  iVar5 = 0x10;
  uVar6 = 8;
  do {
    uVar4 = uVar2 >> (sbyte)uVar6;
    uVar7 = uVar6;
    if (uVar4 == 0) {
      uVar7 = 0;
      uVar4 = uVar2;
    }
    uVar2 = uVar4;
    iVar5 = iVar5 - uVar7;
    bVar1 = 1 < uVar6;
    uVar6 = uVar6 >> 1;
  } while (bVar1);
  *(short *)((long)(env->active_fpu).fpr + lVar3 + 0xe) = (short)iVar5 - (short)uVar2;
  return;
}

Assistant:

void helper_msa_nlzc_h(CPUMIPSState *env, uint32_t wd, uint32_t ws)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);

    pwd->h[0]  = msa_nlzc_df(DF_HALF, pws->h[0]);
    pwd->h[1]  = msa_nlzc_df(DF_HALF, pws->h[1]);
    pwd->h[2]  = msa_nlzc_df(DF_HALF, pws->h[2]);
    pwd->h[3]  = msa_nlzc_df(DF_HALF, pws->h[3]);
    pwd->h[4]  = msa_nlzc_df(DF_HALF, pws->h[4]);
    pwd->h[5]  = msa_nlzc_df(DF_HALF, pws->h[5]);
    pwd->h[6]  = msa_nlzc_df(DF_HALF, pws->h[6]);
    pwd->h[7]  = msa_nlzc_df(DF_HALF, pws->h[7]);
}